

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O2

void __thiscall vkb::SwapchainBuilder::SwapchainBuilder(SwapchainBuilder *this,Device *device)

{
  uint *puVar1;
  Result<unsigned_int> graphics;
  Result<unsigned_int> present;
  
  SwapchainInfo::SwapchainInfo(&this->info);
  (this->info).physical_device = (device->physical_device).physical_device;
  (this->info).device = device->device;
  (this->info).surface = device->surface;
  (this->info).instance_version = device->instance_version;
  Device::get_queue_index(&present,device,present);
  Device::get_queue_index(&graphics,device,graphics);
  if ((graphics.m_init == true) && (present.m_init == true)) {
    puVar1 = Result<unsigned_int>::value(&present);
    (this->info).graphics_queue_index = *puVar1;
    puVar1 = Result<unsigned_int>::value(&graphics);
    (this->info).present_queue_index = *puVar1;
    return;
  }
  __assert_fail("graphics.has_value() && present.has_value() && \"Graphics and Present queue indexes must be valid\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/charles-lunarg[P]vk-bootstrap/src/VkBootstrap.cpp"
                ,0x74a,"vkb::SwapchainBuilder::SwapchainBuilder(const Device &)");
}

Assistant:

SwapchainBuilder::SwapchainBuilder(Device const& device) {
    info.physical_device = device.physical_device.physical_device;
    info.device = device.device;
    info.surface = device.surface;
    info.instance_version = device.instance_version;
    auto present = device.get_queue_index(QueueType::present);
    auto graphics = device.get_queue_index(QueueType::graphics);
    assert(graphics.has_value() && present.has_value() && "Graphics and Present queue indexes must be valid");
    info.graphics_queue_index = present.value();
    info.present_queue_index = graphics.value();
}